

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

Aig_Man_t *
Saig_ManDupUnfoldConstrsFunc
          (Aig_Man_t *pAig,int nFrames,int nConfs,int nProps,int fOldAlgo,int fVerbose)

{
  Vec_Vec_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *p;
  Vec_Ptr_t *pVVar5;
  int local_68;
  int local_64;
  int nNewFlops;
  int k;
  int j;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNewFlops;
  Vec_Ptr_t *vNodes;
  Vec_Vec_t *vCands;
  Aig_Man_t *pNew;
  int local_28;
  int fVerbose_local;
  int fOldAlgo_local;
  int nProps_local;
  int nConfs_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  pNew._4_4_ = fVerbose;
  local_28 = fOldAlgo;
  fVerbose_local = nProps;
  fOldAlgo_local = nConfs;
  nProps_local = nFrames;
  _nConfs_local = pAig;
  if (fOldAlgo == 0) {
    vNodes = (Vec_Ptr_t *)Ssw_ManFindDirectImplications(pAig,nFrames,nConfs,nProps,fVerbose);
  }
  else {
    vNodes = (Vec_Ptr_t *)Saig_ManDetectConstrFunc(pAig,nFrames,nConfs,nProps,fVerbose);
  }
  if ((vNodes == (Vec_Ptr_t *)0x0) || (iVar2 = Vec_VecSizeSize((Vec_Vec_t *)vNodes), iVar2 == 0)) {
    Vec_VecFreeP((Vec_Vec_t **)&vNodes);
    pAig_local = Aig_ManDupDfs(_nConfs_local);
  }
  else {
    vCands = (Vec_Vec_t *)Aig_ManDupWithoutPos(_nConfs_local);
    iVar2 = _nConfs_local->nConstrs;
    iVar3 = Vec_VecSizeSize((Vec_Vec_t *)vNodes);
    *(int *)&vCands[7].pArray = iVar2 + iVar3;
    for (k = 0; iVar2 = Saig_ManPoNum(_nConfs_local), k < iVar2; k = k + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(_nConfs_local->vCos,k);
      pVVar1 = vCands;
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      Aig_ObjCreateCo((Aig_Man_t *)pVVar1,pAVar4);
    }
    p = Vec_PtrAlloc(100);
    for (k = 0; iVar2 = Vec_VecSize((Vec_Vec_t *)vNodes), k < iVar2; k = k + 1) {
      pVVar5 = Vec_VecEntry((Vec_Vec_t *)vNodes,k);
      for (local_64 = 0; iVar2 = Vec_PtrSize(pVVar5), local_64 < iVar2; local_64 = local_64 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,local_64);
        pAVar4 = Aig_ObjRealCopy(pAVar4);
        Vec_PtrPush(p,pAVar4);
        for (nNewFlops = 0; pVVar1 = vCands, nNewFlops < k; nNewFlops = nNewFlops + 1) {
          pAVar4 = Aig_ObjCreateCi((Aig_Man_t *)vCands);
          Vec_PtrPush(p,pAVar4);
        }
        pAVar4 = (Aig_Obj_t *)Vec_PtrPop(p);
        Aig_ObjCreateCo((Aig_Man_t *)pVVar1,pAVar4);
      }
    }
    for (k = 0; iVar2 = Saig_ManRegNum(_nConfs_local), k < iVar2; k = k + 1) {
      pVVar5 = _nConfs_local->vCos;
      iVar2 = Saig_ManPoNum(_nConfs_local);
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,k + iVar2);
      pVVar1 = vCands;
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      Aig_ObjCreateCo((Aig_Man_t *)pVVar1,pAVar4);
    }
    local_68 = 0;
    for (k = 0; iVar2 = Vec_VecSize((Vec_Vec_t *)vNodes), k < iVar2; k = k + 1) {
      pVVar5 = Vec_VecEntry((Vec_Vec_t *)vNodes,k);
      for (local_64 = 0; iVar2 = Vec_PtrSize(pVVar5), local_64 < iVar2; local_64 = local_64 + 1) {
        Vec_PtrEntry(pVVar5,local_64);
        for (nNewFlops = 0; pVVar1 = vCands, nNewFlops < k; nNewFlops = nNewFlops + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p,local_68);
          Aig_ObjCreateCo((Aig_Man_t *)pVVar1,pAVar4);
          local_68 = local_68 + 1;
        }
      }
    }
    iVar2 = Vec_PtrSize(p);
    pVVar1 = vCands;
    if (local_68 != iVar2) {
      __assert_fail("nNewFlops == Vec_PtrSize(vNewFlops)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr2.c"
                    ,0x39c,
                    "Aig_Man_t *Saig_ManDupUnfoldConstrsFunc(Aig_Man_t *, int, int, int, int, int)")
      ;
    }
    iVar2 = Aig_ManRegNum(_nConfs_local);
    Aig_ManSetRegNum((Aig_Man_t *)pVVar1,iVar2 + local_68);
    Vec_VecFreeP((Vec_Vec_t **)&vNodes);
    Vec_PtrFree(p);
    pAig_local = (Aig_Man_t *)vCands;
  }
  return pAig_local;
}

Assistant:

Aig_Man_t * Saig_ManDupUnfoldConstrsFunc( Aig_Man_t * pAig, int nFrames, int nConfs, int nProps, int fOldAlgo, int fVerbose )
{
    Aig_Man_t * pNew;
    Vec_Vec_t * vCands;
    Vec_Ptr_t * vNodes, * vNewFlops;
    Aig_Obj_t * pObj;
    int i, j, k, nNewFlops;
    if ( fOldAlgo )
        vCands = Saig_ManDetectConstrFunc( pAig, nFrames, nConfs, nProps, fVerbose );
    else
        vCands = Ssw_ManFindDirectImplications( pAig, nFrames, nConfs, nProps, fVerbose );
    if ( vCands == NULL || Vec_VecSizeSize(vCands) == 0 )
    {
        Vec_VecFreeP( &vCands );
        return Aig_ManDupDfs( pAig );
    }
    // create new manager
    pNew = Aig_ManDupWithoutPos( pAig );
    pNew->nConstrs = pAig->nConstrs + Vec_VecSizeSize(vCands);
    // add normal POs
    Saig_ManForEachPo( pAig, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // create constraint outputs
    vNewFlops = Vec_PtrAlloc( 100 );
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            Vec_PtrPush( vNewFlops, Aig_ObjRealCopy(pObj) );
            for ( j = 0; j < i; j++ )
                Vec_PtrPush( vNewFlops, Aig_ObjCreateCi(pNew) );
            Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrPop(vNewFlops) );
        }
    }
    // add latch outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // add new latch outputs
    nNewFlops = 0;
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            for ( j = 0; j < i; j++ )
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vNewFlops, nNewFlops++) );
        }
    }
    assert( nNewFlops == Vec_PtrSize(vNewFlops) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(pAig) + nNewFlops );
    Vec_VecFreeP( &vCands );
    Vec_PtrFree( vNewFlops );
    return pNew;
}